

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O1

unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
 __thiscall
so_5::details::make_message_instance_impl<false,so_5::stats::messages::quantity<unsigned_long>>::
make<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long_const&>
          (make_message_instance_impl<false,so_5::stats::messages::quantity<unsigned_long>> *this,
          prefix_t *args,suffix_t *args_1,unsigned_long *args_2)

{
  __int_type _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  message_t *this_00;
  
  this_00 = (message_t *)operator_new(0x58);
  _Var1 = *args_2;
  message_t::message_t(this_00);
  this_00->_vptr_message_t = (_func_int **)&PTR__signal_t_0028bdf8;
  uVar2 = *(undefined8 *)(args->m_value + 8);
  uVar3 = *(undefined8 *)(args->m_value + 0x10);
  uVar4 = *(undefined8 *)(args->m_value + 0x18);
  uVar5 = *(undefined8 *)(args->m_value + 0x10);
  uVar6 = *(undefined8 *)(args->m_value + 0x18);
  uVar7 = *(undefined8 *)(args->m_value + 0x20);
  uVar8 = *(undefined8 *)(args->m_value + 0x28);
  *(undefined8 *)&this_00->field_0x14 = *(undefined8 *)args->m_value;
  *(undefined8 *)((long)&this_00[1]._vptr_message_t + 4) = uVar2;
  *(undefined8 *)
   ((long)&this_00[1].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>.
           _M_i + 4) = uVar3;
  *(undefined8 *)&this_00[1].field_0x14 = uVar4;
  *(undefined8 *)
   ((long)&this_00[1].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>.
           _M_i + 4) = uVar5;
  *(undefined8 *)&this_00[1].field_0x14 = uVar6;
  *(undefined8 *)((long)&this_00[2]._vptr_message_t + 4) = uVar7;
  *(undefined8 *)
   ((long)&this_00[2].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>.
           _M_i + 4) = uVar8;
  this_00[3]._vptr_message_t = (_func_int **)args_1->m_value;
  this_00[3].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>._M_i = _Var1
  ;
  *(message_t **)this = this_00;
  return (__uniq_ptr_data<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr< E >
		make( ARGS &&... args )
			{
				ensure_not_signal< MSG >();

				return std::unique_ptr< E >( new E( std::forward< ARGS >(args)... ) );
			}